

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W_final.cpp
# Opt level: O2

energy_t __thiscall W_final::hfold(W_final *this,sparse_tree *tree)

{
  pointer pNVar1;
  s_energy_matrix *this_00;
  bool bVar2;
  energy_t eVar3;
  energy_t eVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  seq_interval *cur_interval;
  cand_pos_t i;
  ulong uVar8;
  ulong uVar9;
  W_final *this_01;
  int j;
  int iVar10;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  initializer_list<int> __l;
  int local_84;
  energy_t local_6c;
  energy_t local_68;
  energy_t local_64;
  ulong local_60;
  sparse_tree *local_58;
  energy_t local_50;
  int local_4c;
  int local_48;
  ulong uVar11;
  
  uVar7 = (ulong)(uint)this->n;
  uVar8 = uVar7 << 5 | 6;
  for (uVar13 = uVar7; iVar6 = (int)uVar13, uVar9 = uVar8, uVar11 = uVar13, 0 < iVar6;
      uVar13 = uVar13 - 1) {
    for (; iVar10 = (int)uVar11, iVar10 <= (int)uVar7; uVar11 = uVar11 + 1) {
      bVar2 = sparse_tree::weakly_closed(tree,iVar6,iVar10);
      pNVar1 = (tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar15 = true;
      bVar14 = true;
      if ((ulong)(uint)pNVar1[uVar13].pair != 0xffffffff) {
        bVar14 = *(int *)((long)&pNVar1->parent + uVar9 * 2) == -1;
      }
      if (uVar11 == (uint)pNVar1[uVar13].pair) {
        bVar15 = uVar13 != *(uint *)((long)&pNVar1->parent + uVar9 * 2);
      }
      if ((((~bVar2 & 1U) == 0 && !bVar14) && 0 < (short)pair[this->S_[uVar13]][this->S_[uVar11]])
         && ((bVar15 & this->pk_only) == 0)) {
        s_energy_matrix::compute_energy_restricted(this->V,iVar6,iVar10,tree);
      }
      if (this->pk_free == false) {
        pseudo_loop::compute_energies(this->WMB,iVar6,iVar10,tree);
      }
      this_00 = this->V;
      eVar3 = pseudo_loop::get_WMB(this->WMB,iVar6,iVar10);
      s_energy_matrix::compute_WMv_WMp(this_00,iVar6,iVar10,eVar3,&tree->tree);
      s_energy_matrix::compute_energy_WM_restricted(this->V,iVar6,iVar10,tree,&this->WMB->WMB);
      uVar7 = (ulong)(uint)this->n;
      uVar9 = uVar9 + 0x20;
    }
    uVar8 = uVar8 - 0x20;
  }
  lVar12 = 4;
  local_60 = 1;
  local_58 = tree;
  while( true ) {
    iVar6 = (int)uVar7;
    if (iVar6 < lVar12) break;
    local_84 = 10000000;
    eVar3 = 10000000;
    if ((tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar12].pair < 0) {
      eVar3 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12 + -1];
    }
    iVar6 = (int)lVar12;
    iVar10 = 10000000;
    for (uVar13 = 1; local_60 != uVar13; uVar13 = uVar13 + 1) {
      iVar5 = 0;
      if (1 < uVar13) {
        iVar5 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13 - 1];
      }
      i = (cand_pos_t)uVar13;
      local_50 = s_energy_matrix::get_energy(this->V,i,iVar6);
      local_64 = s_energy_matrix::get_energy(this->V,i + 1,iVar6);
      local_68 = s_energy_matrix::get_energy(this->V,i,iVar6 + -1);
      this_01 = (W_final *)this->V;
      local_6c = s_energy_matrix::get_energy((s_energy_matrix *)this_01,i + 1,iVar6 + -1);
      tree = local_58;
      eVar4 = E_ext_Stem(this_01,&local_50,&local_64,&local_68,&local_6c,this->S_,this->params_,i,
                         iVar6,this->n,&local_58->tree);
      if (eVar4 + iVar5 < iVar10) {
        iVar10 = eVar4 + iVar5;
      }
      if ((uVar13 == 1) ||
         ((bVar2 = sparse_tree::weakly_closed(tree,1,i + -1), bVar2 &&
          (bVar2 = sparse_tree::weakly_closed(tree,i,iVar6), bVar2)))) {
        eVar4 = pseudo_loop::get_WMB(this->WMB,i,iVar6);
        iVar5 = eVar4 + iVar5 + PS_penalty;
        if (iVar5 < local_84) {
          local_84 = iVar5;
        }
      }
    }
    local_48 = local_84;
    __l._M_len = 3;
    __l._M_array = &local_50;
    local_50 = eVar3;
    local_4c = iVar10;
    iVar6 = std::min<int>(__l);
    (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar12] = iVar6;
    lVar12 = lVar12 + 1;
    local_60 = local_60 + 1;
    uVar7 = (ulong)(uint)this->n;
  }
  eVar3 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar6];
  cur_interval = (seq_interval *)operator_new(0x18);
  this->stack_interval = cur_interval;
  cur_interval->i = 1;
  cur_interval->j = iVar6;
  cur_interval->energy = eVar3;
  cur_interval->type = 'W';
  cur_interval->next = (seq_interval *)0x0;
  while (cur_interval != (seq_interval *)0x0) {
    this->stack_interval = cur_interval->next;
    backtrack_restricted(this,cur_interval,tree);
    operator_delete(cur_interval,0x18);
    cur_interval = this->stack_interval;
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&this->structure);
  std::__cxx11::string::operator=((string *)&this->structure,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return eVar3;
}

Assistant:

energy_t W_final::hfold(sparse_tree &tree){

		for (int i = n; i >=1; --i)
		{	
			for (int j =i; j<=n; ++j)//for (i=0; i<=j; i++)
			{
				const bool evaluate = tree.weakly_closed(i,j);
				const pair_type ptype_closing = pair[S_[i]][S_[j]];
				const bool restricted = tree.tree[i].pair == -1 || tree.tree[j].pair == -1;
				const bool paired = (tree.tree[i].pair == j && tree.tree[j].pair == i);

				const bool pkonly = (!pk_only || paired);

				if(ptype_closing> 0 && evaluate && !restricted && pkonly)
				V->compute_energy_restricted (i,j,tree);

				if(!pk_free) WMB->compute_energies(i,j,tree);


				V->compute_WMv_WMp(i,j,WMB->get_WMB(i,j),tree.tree);
				V->compute_energy_WM_restricted(i,j,tree,WMB->WMB);
			}

		}

	for (cand_pos_t j= TURN+1; j <= n; j++){
		energy_t m1 = INF;
		energy_t m2 = INF;
		energy_t m3 = INF;
		if(tree.tree[j].pair < 0) m1 = W[j-1];
		
		
		for (cand_pos_t k=1; k<=j-TURN-1; ++k){
		 	// m2 = compute_W_br2_restricted (j, fres, must_choose_this_branch);
			energy_t acc = (k>1) ? W[k-1]: 0;
			m2 = std::min(m2,acc + E_ext_Stem(V->get_energy(k,j),V->get_energy(k+1,j),V->get_energy(k,j-1),V->get_energy(k+1,j-1),S_,params_,k,j,n,tree.tree));
			if (k == 1 || (tree.weakly_closed(1,k-1) && tree.weakly_closed(k,j))) m3 = std::min(m3,acc + WMB->get_WMB(k,j) + PS_penalty);
			}
		W[j] = std::min({m1,m2,m3});
	}

    energy_t energy = W[n];

    // backtrack
    // first add (1,n) on the stack
    stack_interval = new seq_interval;
    stack_interval->i = 1;
    stack_interval->j = n;
    stack_interval->energy = W[n];
    stack_interval->type = FREE;
    stack_interval->next = NULL;

    seq_interval *cur_interval = stack_interval;

    while ( cur_interval != NULL)
    {
        stack_interval = stack_interval->next;
        backtrack_restricted (cur_interval,tree);
        delete cur_interval;    // this should make up for the new in the insert_node
        cur_interval = stack_interval;
    }
	this->structure = structure.substr(1,n);
    return energy;

}